

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O0

void __thiscall Object::externalOcclusion(Object *this,Object *obj,Vector2d *obs)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  const_reference pvVar4;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  *in_RDX;
  Vector2d *in_RSI;
  Edge *in_RDI;
  Object *unaff_retaddr;
  Edge *this_edge;
  size_t top;
  size_t i;
  HeapType heap;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  *this_00;
  EdgeCompFunctor *__x;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  *in_stack_ffffffffffffff80;
  ulong local_70;
  EdgeCompFunctor local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  local_40;
  Edge *src;
  
  this_00 = &local_40;
  src = in_RDI;
  EdgeCompFunctor::EdgeCompFunctor
            ((EdgeCompFunctor *)this_00,
             (vector<Edge,_std::allocator<Edge>_> *)
             &(in_RDI->
              super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ).
              super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start);
  local_58.egs = (vector<Edge,_std::allocator<Edge>_> *)0x0;
  uStack_50 = 0;
  local_48 = 0;
  __x = &local_58;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x147e74);
  std::
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  ::priority_queue(in_stack_ffffffffffffff80,__x,&this_00->c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&in_RDX->c);
  for (local_70 = 0;
      sVar2 = std::vector<Edge,_std::allocator<Edge>_>::size
                        ((vector<Edge,_std::allocator<Edge>_> *)
                         &(in_RDI->
                          super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ).
                          super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start), local_70 < sVar2;
      local_70 = local_70 + 1) {
    pvVar3 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)
                        &(in_RDI->
                         super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ).
                         super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Deque_impl_data._M_start,local_70);
    if ((pvVar3->valid & 1U) != 0) {
      std::
      priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,EdgeCompFunctor>
      ::emplace<unsigned_long&>(this_00,(unsigned_long *)in_RDI);
    }
  }
  while (bVar1 = std::
                 priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                 ::empty((priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                          *)0x147f59), !bVar1) {
    pvVar4 = std::
             priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
             ::top((priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                    *)0x147f7a);
    std::vector<Edge,_std::allocator<Edge>_>::operator[]
              ((vector<Edge,_std::allocator<Edge>_> *)
               &(in_RDI->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ).
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start,*pvVar4);
    std::
    priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
    ::pop(in_RDX);
    externalProjector(unaff_retaddr,src,in_RSI);
  }
  std::
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  ::~priority_queue((priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                     *)0x147fde);
  return;
}

Assistant:

void Object::externalOcclusion(Object& obj, Eigen::Vector2d obs) {
    HeapType heap(edges);
    for (size_t i = 0; i < edges.size(); i++) {
        if (edges[i].valid)
            heap.emplace(i);
    }
    while (heap.empty() == false) {
        size_t top = heap.top();
        Edge& this_edge = edges[top];
        heap.pop();
        obj.externalProjector(this_edge, obs);
    }
}